

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::mousePressEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  ulong uVar4;
  uint uVar5;
  QTreeView *pQVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar3 = QWidget::style((QWidget *)this);
  pQVar6 = this;
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x28,0,this,0);
  uVar5 = (uint)pQVar6;
  if (iVar2 == 2) {
    auVar10 = QEventPoint::position();
    auVar9._0_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._8_8_;
    auVar9._8_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._0_8_;
    auVar9 = minpd(_DAT_0066f5d0,auVar9);
    auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
    auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
    uVar5 = movmskpd(uVar5,auVar10);
    local_48._0_8_ = ZEXT48((uint)(int)auVar9._8_8_);
    uVar4 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
    if ((uVar5 & 1) == 0) {
      uVar4 = 0x8000000000000000;
    }
    if ((uVar5 & 2) == 0) {
      local_48._0_8_ = 0x80000000;
    }
    local_48._0_8_ = local_48._0_8_ | uVar4;
    bVar1 = QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,(QPoint *)&local_48);
    if (!bVar1) goto LAB_005aeec2;
  }
  else {
LAB_005aeec2:
    auVar9 = QEventPoint::position();
    auVar7._0_8_ = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar9._8_8_;
    auVar7._8_8_ = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar9._0_8_;
    auVar9 = minpd(_DAT_0066f5d0,auVar7);
    auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
    auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
    uVar5 = movmskpd(uVar5,auVar8);
    uVar4 = 0x8000000000000000;
    if ((uVar5 & 1) != 0) {
      uVar4 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
    }
    local_48._0_8_ = 0x80000000;
    if ((uVar5 & 2) != 0) {
      local_48._0_8_ = (ulong)(uint)(int)auVar9._8_8_;
    }
    local_48._0_8_ = local_48._0_8_ | uVar4;
    iVar2 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_48);
    if (iVar2 == -1) {
      QAbstractItemView::mousePressEvent((QAbstractItemView *)this,event);
      goto LAB_005aef67;
    }
  }
  local_48.r = -1;
  local_48.c = -1;
  local_48.i = 0;
  local_48.m.ptr = (QAbstractItemModel *)0x0;
  QPersistentModelIndex::operator=
            (&(this_00->super_QAbstractItemViewPrivate).pressedIndex,&local_48);
LAB_005aef67:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    bool handled = false;
    if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonPress)
        handled = d->expandOrCollapseItemAtPos(event->position().toPoint());
    if (!handled && d->itemDecorationAt(event->position().toPoint()) == -1)
        QAbstractItemView::mousePressEvent(event);
    else
        d->pressedIndex = QModelIndex();
}